

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

int __thiscall Cmd::getColumns(Cmd *this)

{
  int iVar1;
  ssize_t sVar2;
  string_view local_68;
  char local_58 [8];
  char seq [32];
  int cols;
  int start;
  winsize ws;
  Cmd *this_local;
  
  ws = (winsize)this;
  iVar1 = ioctl(1,0x5413,&cols);
  if ((iVar1 == -1) || (cols._2_2_ == 0)) {
    iVar1 = getCursorPosition(this);
    if (iVar1 == -1) {
      this_local._4_4_ = 0x50;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(seq + 0x18),"\x1b[999C");
      sVar2 = write_string(this,stack0xffffffffffffffc8);
      if (sVar2 == 6) {
        this_local._4_4_ = getCursorPosition(this);
        if (this_local._4_4_ == 0xffffffff) {
          this_local._4_4_ = 0x50;
        }
        else if (iVar1 < (int)this_local._4_4_) {
          snprintf(local_58,0x20,"\x1b[%dD",(ulong)(this_local._4_4_ - iVar1));
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_68,local_58);
          write_string(this,local_68);
        }
      }
      else {
        this_local._4_4_ = 0x50;
      }
    }
  }
  else {
    this_local._4_4_ = (uint)cols._2_2_;
  }
  return this_local._4_4_;
}

Assistant:

int getColumns() {
		struct winsize ws;

		if (ioctl(1, TIOCGWINSZ, &ws) == -1 || ws.ws_col == 0) {
			// ioctl() failed. Try to query the terminal itself.
			int start, cols;

			// Get the initial position so we can restore it later.
			start = getCursorPosition();
			if (start == -1)
				return 80;

			// Go to right margin and get position.
			if (write_string("\x1b[999C") != 6)
				return 80;
			cols = getCursorPosition();
			if (cols == -1)
				return 80;

			// Restore position.
			if (cols > start) {
				char seq[32];
				snprintf(seq, sizeof(seq), "\x1b[%dD", cols - start);
				if (write_string(seq) == -1) {
					// Can't recover...
				}
			}
			return cols;
		} else {
			return ws.ws_col;
		}
	}